

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* nlohmann::json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string_t *reference_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  parse_error *ppVar5;
  char (*in_R8) [2];
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> reference_token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined2 *local_78;
  long local_70;
  undefined2 local_68;
  undefined6 uStack_66;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  value_type local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = __return_storage_ptr__;
  if (reference_string->_M_string_length != 0) {
    if (*(reference_string->_M_dataplus)._M_p != '/') {
      ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
      detail::
      concat<std::__cxx11::string,char_const(&)[54],std::__cxx11::string_const&,char_const(&)[2]>
                (&local_98,(detail *)"JSON pointer must be empty or begin with \'/\' - was: \'",
                 (char (*) [54])reference_string,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x141453,in_R8
                );
      detail::parse_error::create<std::nullptr_t,_0>(ppVar5,0x6b,1,&local_98,(void *)0x0);
      __cxa_throw(ppVar5,&detail::parse_error::typeinfo,detail::exception::~exception);
    }
    lVar2 = std::__cxx11::string::find((char)reference_string,0x2f);
    paVar1 = &local_98.field_2;
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)reference_string);
      while (lVar3 = std::__cxx11::string::find((char)&local_50,0x7e), lVar3 != -1) {
        if ((lVar3 == local_50._M_string_length - 1) ||
           ((local_50._M_dataplus._M_p[lVar3 + 1] & 0xfeU) != 0x30)) {
          ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
          local_98._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,
                     "escape character \'~\' must be followed with \'0\' or \'1\'","");
          detail::parse_error::create<std::nullptr_t,_0>(ppVar5,0x6c,0,&local_98,(void *)0x0);
          __cxa_throw(ppVar5,&detail::parse_error::typeinfo,detail::exception::~exception);
        }
      }
      local_98.field_2._M_allocated_capacity._0_2_ = 0x317e;
      local_98._M_string_length = 2;
      local_98.field_2._M_local_buf[2] = '\0';
      local_68 = 0x2f;
      local_70 = 1;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      local_78 = &local_68;
      for (uVar4 = std::__cxx11::string::find((char *)&local_50,(ulong)paVar1,0);
          uVar4 != 0xffffffffffffffff;
          uVar4 = std::__cxx11::string::find
                            ((char *)&local_50,(ulong)local_98._M_dataplus._M_p,uVar4 + local_70)) {
        std::__cxx11::string::replace
                  ((ulong)&local_50,uVar4,(char *)local_98._M_string_length,(ulong)local_78);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT62(uStack_66,local_68) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT53(local_98.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_98.field_2._M_local_buf[2],
                                          local_98.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      local_98.field_2._M_allocated_capacity._0_2_ = 0x307e;
      local_98._M_string_length = 2;
      local_98.field_2._M_local_buf[2] = '\0';
      local_68 = 0x7e;
      local_70 = 1;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      local_78 = &local_68;
      for (uVar4 = std::__cxx11::string::find((char *)&local_50,(ulong)paVar1,0);
          uVar4 != 0xffffffffffffffff;
          uVar4 = std::__cxx11::string::find
                            ((char *)&local_50,(ulong)local_98._M_dataplus._M_p,uVar4 + local_70)) {
        std::__cxx11::string::replace
                  ((ulong)&local_50,uVar4,(char *)local_98._M_string_length,(ulong)local_78);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT62(uStack_66,local_68) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT53(local_98.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_98.field_2._M_local_buf[2],
                                          local_98.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_58,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar3 = std::__cxx11::string::find((char)reference_string,0x2f);
      bVar6 = lVar2 != -1;
      lVar2 = lVar3;
    } while (bVar6);
  }
  return local_58;
}

Assistant:

json_pointer& operator/=(const json_pointer& ptr)
    {
        reference_tokens.insert(reference_tokens.end(),
                                ptr.reference_tokens.begin(),
                                ptr.reference_tokens.end());
        return *this;
    }